

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_true,_true>::delete_sib_(DaTrie<true,_true,_true> *this,uint32_t node_pos)

{
  uint8_t uVar1;
  pointer pBVar2;
  pointer pNVar3;
  Bc BVar4;
  Bc BVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  BVar4 = pBVar2[node_pos];
  uVar6 = (ulong)BVar4 >> 0x20 & 0x7fffffff;
  BVar5 = pBVar2[uVar6];
  bVar7 = (byte)node_pos ^ BVar5._0_1_;
  bVar9 = (&pNVar3->child)[(uint)(BVar4._4_4_ * 2)];
  do {
    uVar8 = (ulong)bVar9 ^ (ulong)BVar5 & 0x7fffffff;
    bVar9 = pNVar3[uVar8].sib;
  } while (bVar9 != bVar7);
  uVar1 = pNVar3[node_pos].sib;
  if ((&pNVar3->child)[(uint)(BVar4._4_4_ * 2)] == bVar7) {
    pNVar3[uVar6].child = uVar1;
  }
  pNVar3[uVar8].sib = uVar1;
  return;
}

Assistant:

void delete_sib_(uint32_t node_pos) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto parent_pos = bc_[node_pos].check();
    auto base = bc_[parent_pos].base();
    auto label = static_cast<uint8_t>(base ^ node_pos);

    auto _node_pos = base ^node_links_[parent_pos].child;
    while (node_links_[_node_pos].sib != label) {
      _node_pos = base ^ node_links_[_node_pos].sib;
    }

    if (node_links_[parent_pos].child == node_links_[_node_pos].sib) {
      node_links_[parent_pos].child = node_links_[node_pos].sib;
    }
    node_links_[_node_pos].sib = node_links_[node_pos].sib;
  }